

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_cavity.c
# Opt level: O1

REF_STATUS ref_cavity_verify_seg_manifold(REF_CAVITY ref_cavity)

{
  int *piVar1;
  long lVar2;
  long lVar3;
  int *piVar4;
  int iVar5;
  long lVar6;
  
  if ((ref_cavity->state != REF_CAVITY_INCONSISTENT) &&
     (lVar2 = (long)ref_cavity->maxseg, 0 < lVar2)) {
    piVar1 = ref_cavity->s2n;
    lVar3 = 0;
    do {
      if (piVar1[lVar3 * 3] != -1) {
        iVar5 = -1;
        lVar6 = 0;
        piVar4 = piVar1;
        do {
          if ((*piVar4 != -1) && (piVar1[lVar3 * 3 + 1] == *piVar4)) {
            if (iVar5 != -1) {
              ref_cavity->state = REF_CAVITY_INCONSISTENT;
              return 0;
            }
            iVar5 = (int)lVar6;
          }
          lVar6 = lVar6 + 1;
          piVar4 = piVar4 + 3;
        } while (lVar2 != lVar6);
        if (iVar5 == -1) {
          printf("%s: %d: %s: %s\n",
                 "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_cavity.c",
                 0x203,"ref_cavity_verify_seg_manifold","seg missing",lVar6,0);
          return 1;
        }
      }
      lVar3 = lVar3 + 1;
    } while (lVar3 != lVar2);
  }
  return 0;
}

Assistant:

REF_FCN static REF_STATUS ref_cavity_verify_seg_manifold(
    REF_CAVITY ref_cavity) {
  REF_INT seg0, seg1, found_seg;

  if (REF_CAVITY_INCONSISTENT == ref_cavity_state(ref_cavity))
    return REF_SUCCESS;

  each_ref_cavity_valid_seg(ref_cavity, seg0) {
    found_seg = REF_EMPTY;
    each_ref_cavity_valid_seg(ref_cavity, seg1) {
      if (ref_cavity_s2n(ref_cavity, 1, seg0) ==
          ref_cavity_s2n(ref_cavity, 0, seg1)) {
        if (REF_EMPTY != found_seg) { /* found seg twice */
          ref_cavity_state(ref_cavity) = REF_CAVITY_INCONSISTENT;
          return REF_SUCCESS;
        }
        found_seg = seg1;
      }
    }
    RUS(REF_EMPTY, found_seg, "seg missing");
  }

  return REF_SUCCESS;
}